

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

void __thiscall
bk_lib::
pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
::resize(pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
         *this,size_type ns,left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *val)

{
  size_type sVar1;
  iterator last;
  iterator x;
  uint in_ESI;
  pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
  *in_RDI;
  pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
  *unaff_retaddr;
  uint uVar2;
  uint uVar3;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar4;
  pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
  *ppVar5;
  size_type n;
  
  uVar3 = in_ESI;
  ppVar5 = in_RDI;
  sVar1 = size(in_RDI);
  n = (size_type)((ulong)ppVar5 >> 0x20);
  uVar2 = uVar3;
  if (sVar1 < in_ESI) {
    sVar1 = capacity(in_RDI);
    if (sVar1 < uVar3) {
      size(in_RDI);
      append_realloc(unaff_retaddr,n,
                     (left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *)
                     CONCAT44(uVar2,in_stack_fffffffffffffff0));
    }
    else {
      last = end(in_RDI);
      x = end(in_RDI);
      uVar4 = uVar2;
      size(in_RDI);
      detail::fill<bk_lib::left_right_sequence<Clasp::ClauseWatch,Clasp::GenericWatch,0u>>
                ((left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *)
                 CONCAT44(uVar3,uVar2),last,x);
      uVar2 = uVar4;
    }
  }
  (in_RDI->ebo_).size = uVar2;
  return;
}

Assistant:

void resize(size_type ns, const T& val = T()) {
		if (ns > size()) {
			ns <= capacity() ? detail::fill(end(), end()+(ns-size()), val) : append_realloc(ns-size(), val);
		}
		ebo_.size = ns;
	}